

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# judger.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  ostream *poVar4;
  long lVar5;
  mapped_type *pmVar6;
  iterator iVar7;
  iterator iVar8;
  mapped_type *pmVar9;
  int iVar10;
  key_type *__k;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  int *playerIDs;
  int i;
  ulong uVar14;
  undefined8 local_1a0;
  int id [11];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  parm;
  int rank [11];
  string replayFile;
  string ppath;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  aipath;
  map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  name;
  string local_50;
  
  parm._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &parm._M_t._M_impl.super__Rb_tree_header._M_header;
  parm._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  parm._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  parm._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  name._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &name._M_t._M_impl.super__Rb_tree_header._M_header;
  name._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  name._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  name._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  aipath._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &aipath._M_t._M_impl.super__Rb_tree_header._M_header;
  aipath._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  aipath._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  aipath._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parm._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       parm._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  aipath._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       aipath._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  name._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       name._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (argc == 1) {
    poVar4 = std::operator<<((ostream *)&std::cout,"AI9 2018 Judger");
    poVar4 = std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_547d);
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"-players=M      Set the number of players to M."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-rounds=R       Set the maximum round to R (optional, default is 3000)."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-replay=F       Set the replay file name to F (optional, default is replay.zip)."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-nameX=N        Set the name of player #X to N (optional, default is \"Attendant\")."
                            );
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "-pathX=P        Set the AI path of player #X to P.");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::operator<<((ostream *)&std::cout,"The range of X is from 0 to M-1.");
    std::endl<char,std::char_traits<char>>(poVar4);
    poVar4 = std::operator<<((ostream *)&std::cout,"Unrecognized parameters will be ignored.");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::operator<<((ostream *)&std::cout,
                             "Example. ./judger -players=3 -rounds=2000 -path0=ai0.so -path1=\"ai0.so\" -path2=\"ai/ai0.so\""
                            );
    local_1a0 = 0;
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  else {
    local_1a0 = 0;
    lVar11 = 1;
    do {
      if (argc <= lVar11) {
        std::__cxx11::string::string((string *)id,"players",(allocator *)rank);
        iVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::find(&parm._M_t,(key_type *)id);
        std::__cxx11::string::~string((string *)id);
        if ((_Rb_tree_header *)iVar7._M_node == &parm._M_t._M_impl.super__Rb_tree_header) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Player count not given!");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        else {
          std::__cxx11::string::string((string *)id,"players",(allocator *)rank);
          pmVar6 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator[](&parm,(key_type *)id);
          uVar2 = std::__cxx11::stoi(pmVar6,(size_t *)0x0,10);
          std::__cxx11::string::~string((string *)id);
          if (0xfffffff8 < uVar2 - 9) {
            std::__cxx11::string::string((string *)id,"rounds",(allocator *)rank);
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&parm._M_t,(key_type *)id);
            std::__cxx11::string::~string((string *)id);
            if ((_Rb_tree_header *)iVar7._M_node == &parm._M_t._M_impl.super__Rb_tree_header) {
              iVar3 = 0x44c;
            }
            else {
              std::__cxx11::string::string((string *)id,"rounds",(allocator *)rank);
              pmVar6 = std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       ::operator[](&parm,(key_type *)id);
              iVar3 = std::__cxx11::stoi(pmVar6,(size_t *)0x0,10);
              std::__cxx11::string::~string((string *)id);
            }
            std::__cxx11::string::string((string *)&replayFile,"replay.zip",(allocator *)id);
            std::__cxx11::string::string((string *)id,"replay",(allocator *)rank);
            iVar7 = std::
                    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::find(&parm._M_t,(key_type *)id);
            std::__cxx11::string::~string((string *)id);
            if ((_Rb_tree_header *)iVar7._M_node != &parm._M_t._M_impl.super__Rb_tree_header) {
              std::__cxx11::string::string((string *)id,"replay",(allocator *)rank);
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[](&parm,(key_type *)id);
              std::__cxx11::string::_M_assign((string *)&replayFile);
              std::__cxx11::string::~string((string *)id);
            }
            setReplayFile(replayFile._M_dataplus._M_p);
            init((EVP_PKEY_CTX *)(ulong)uVar2);
            playerIDs = id;
            id[8] = 0;
            id[9] = 0;
            id[10] = 0;
            id[4] = 0;
            id[5] = 0;
            id[6] = 0;
            id[7] = 0;
            id[0] = 0;
            id[1] = 0;
            id[2] = 0;
            id[3] = 0;
            getPlayerIDs(playerIDs);
            uVar12 = (ulong)uVar2;
            uVar14 = 0;
            goto LAB_00121f59;
          }
          poVar4 = std::operator<<((ostream *)&std::cout,"Player count out of range!");
          std::endl<char,std::char_traits<char>>(poVar4);
        }
        local_1a0 = 1;
        break;
      }
      std::__cxx11::string::string((string *)id,argv[lVar11],(allocator *)rank);
      lVar5 = std::__cxx11::string::find((char)(string *)id,0x3d);
      if (((id._8_8_ == 0) || (lVar5 == -1)) || (*(char *)id._0_8_ != '-')) {
        poVar4 = std::operator<<((ostream *)&std::cout,"Parameter format incorrect!");
        std::endl<char,std::char_traits<char>>(poVar4);
        bVar1 = false;
        local_1a0 = 1;
      }
      else {
        std::__cxx11::string::substr((ulong)rank,(ulong)id);
        std::__cxx11::string::substr((ulong)&replayFile,(ulong)id);
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&parm,&replayFile);
        std::__cxx11::string::operator=((string *)pmVar6,(string *)rank);
        std::__cxx11::string::~string((string *)&replayFile);
        std::__cxx11::string::~string((string *)rank);
        bVar1 = true;
      }
      std::__cxx11::string::~string((string *)id);
      lVar11 = lVar11 + 1;
    } while (bVar1);
  }
  goto LAB_00122258;
  while( true ) {
    std::__cxx11::to_string(&ppath,iVar10);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rank,"name",
                   &ppath);
    std::__cxx11::string::~string((string *)&ppath);
    std::__cxx11::to_string(&local_50,iVar10);
    std::operator+(&ppath,"path",&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    iVar7 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::find(&parm._M_t,&ppath);
    if ((_Rb_tree_header *)iVar7._M_node == &parm._M_t._M_impl.super__Rb_tree_header) {
      poVar4 = std::operator<<((ostream *)&std::cout,"AI path of player #");
      poVar4 = (ostream *)std::ostream::operator<<(poVar4,iVar10);
      poVar4 = std::operator<<(poVar4," not specified!");
      std::endl<char,std::char_traits<char>>(poVar4);
      local_1a0 = 1;
    }
    else {
      iVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::find(&parm._M_t,(key_type *)rank);
      if ((_Rb_tree_header *)iVar8._M_node == &parm._M_t._M_impl.super__Rb_tree_header) {
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](&parm,(key_type *)rank);
        std::__cxx11::string::assign((char *)pmVar6);
      }
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&parm,(key_type *)rank);
      pmVar9 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name,playerIDs);
      std::__cxx11::string::_M_assign((string *)pmVar9);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[](&parm,&ppath);
      pmVar9 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&aipath,playerIDs);
      std::__cxx11::string::_M_assign((string *)pmVar9);
      iVar10 = *playerIDs;
      pmVar9 = std::
               map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&name,playerIDs);
      setPlayerName(iVar10,(pmVar9->_M_dataplus)._M_p);
    }
    std::__cxx11::string::~string((string *)&ppath);
    std::__cxx11::string::~string((string *)rank);
    uVar14 = uVar14 + 1;
    playerIDs = playerIDs + 1;
    if ((_Rb_tree_header *)iVar7._M_node == &parm._M_t._M_impl.super__Rb_tree_header) break;
LAB_00121f59:
    iVar10 = (int)uVar14;
    if (uVar12 == uVar14) {
      __k = id;
      lVar11 = 0;
      goto LAB_00122122;
    }
  }
  goto LAB_0012224b;
  while( true ) {
    pmVar9 = std::
             map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[](&aipath,__k);
    bVar1 = loadAI((pmVar9->_M_dataplus)._M_p,*__k);
    lVar11 = lVar11 + -4;
    __k = __k + 1;
    if (!bVar1) break;
LAB_00122122:
    if (uVar12 * 4 + lVar11 == 0) {
      iVar10 = 0;
      if (0 < iVar3) {
        iVar10 = iVar3;
      }
      iVar10 = iVar10 + 1;
      goto LAB_001221b6;
    }
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"Failed to load ");
  pmVar9 = std::
           map<int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[](&aipath,(key_type *)((long)id + (-4 - lVar11)));
  poVar4 = std::operator<<(poVar4,(string *)pmVar9);
  poVar4 = std::operator<<(poVar4,"!");
  std::endl<char,std::char_traits<char>>(poVar4);
  local_1a0 = 1;
  goto LAB_0012224b;
  while( true ) {
    invokeAI();
    run();
    iVar3 = checkWin();
    if (iVar3 != -1) break;
LAB_001221b6:
    iVar10 = iVar10 + -1;
    if (iVar10 == 0) break;
  }
  rank[8] = 0;
  rank[9] = 0;
  rank[10] = 0;
  rank[4] = 0;
  rank[5] = 0;
  rank[6] = 0;
  rank[7] = 0;
  rank[0] = 0;
  rank[1] = 0;
  rank[2] = 0;
  rank[3] = 0;
  getRank(rank);
  for (uVar14 = 0; uVar14 != uVar12; uVar14 = uVar14 + 1) {
    for (uVar13 = 0; uVar12 != uVar13; uVar13 = uVar13 + 1) {
      if (rank[uVar14] == id[uVar13]) {
        poVar4 = (ostream *)std::ostream::operator<<(&std::cout,(int)uVar13);
        std::operator<<(poVar4," ");
        break;
      }
    }
  }
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  closeReplayFile();
  local_1a0 = 0;
LAB_0012224b:
  std::__cxx11::string::~string((string *)&replayFile);
LAB_00122258:
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&aipath._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&name._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&parm._M_t);
  return (int)local_1a0;
}

Assistant:

int main(int argc, char** argv)
{
    map<string, string> parm;
    map<int, string> name, aipath;

    if (argc == 1)
    {
        cout << "AI9 2018 Judger" << endl << endl;
        cout << "Parameters：" << endl;
        cout << "-players=M      Set the number of players to M." << endl;
        cout << "-rounds=R       Set the maximum round to R (optional, default is 3000)." << endl;
        cout << "-replay=F       Set the replay file name to F (optional, default is replay.zip)." << endl;
        cout << "-nameX=N        Set the name of player #X to N (optional, default is \"Attendant\")." << endl;
        cout << "-pathX=P        Set the AI path of player #X to P." << endl;
        cout << endl;
        cout << "The range of X is from 0 to M-1." << endl;
        cout << "Unrecognized parameters will be ignored." << endl;
        cout << endl;
#if defined(_WIN32)
        cout << "Example. ./judger -players=3 -rounds=2000 -path0=ai0.dll -path1=\"ai0.dll\" -path2=\"ai/ai0.dll\"" << endl;
#elif defined(__APPLE__)
        cout << "Example. ./judger -players=3 -rounds=2000 -path0=ai0.dylib -path1=\"ai0.dylib\" -path2=\"ai/ai0.dylib\"" << endl;
#else
        cout << "Example. ./judger -players=3 -rounds=2000 -path0=ai0.so -path1=\"ai0.so\" -path2=\"ai/ai0.so\"" << endl;
#endif
        return 0;
    }

    for (int i = 1; i < argc; ++i)
    {
        string s(argv[i]);
        size_t pos = s.find('=');
        if (s.length() == 0 || s[0] != '-' || pos == string::npos)
        {
            cout << "Parameter format incorrect!" << endl;
            return 1;
        }
        parm[s.substr(1, pos - 1)] = s.substr(pos + 1);
    }

    if (parm.find("players") == parm.end())
    {
        cout << "Player count not given!" << endl;
        return 1;
    }
    int playerNum = stoi(parm["players"]);
    if (playerNum < 2 || playerNum > 8)
    {
        cout << "Player count out of range!" << endl;
        return 1;
    }

    int maxRounds = 1100;
    if (parm.find("rounds") != parm.end())
        maxRounds = stoi(parm["rounds"]);

    string replayFile("replay.zip");
    if (parm.find("replay") != parm.end())
        replayFile = parm["replay"];

    setReplayFile(replayFile.c_str());

    init(playerNum);
    int id[MAXPLAYERNUM + 5] = {0};
    getPlayerIDs(id);

    for (int i = 0; i < playerNum; ++i)
    {
        string pname = "name" + to_string(i);
        string ppath = "path" + to_string(i);
        if (parm.find(ppath) == parm.end())
        {
            cout << "AI path of player #" << i << " not specified!" << endl;
            return 1;
        }
        if (parm.find(pname) == parm.end())
            parm[pname] = "Attendant";
        name[id[i]] = parm[pname];
        aipath[id[i]] = parm[ppath];

        setPlayerName(id[i], name[id[i]].c_str());
    }

    for (int i = 0; i < playerNum; ++i)
        if (!loadAI(aipath[id[i]].c_str(), id[i]))
        {
            cout << "Failed to load " << aipath[id[i]] << "!" << endl;
            return 1;
        }

    for (int i = 0; i < maxRounds; ++i)
    {
        invokeAI();
        run();
        if (checkWin() != -1)
            break;
    }

    int rank[MAXPLAYERNUM + 5] = {0};
    getRank(rank);

    for (int i = 0; i < playerNum; ++i)
        for (int j = 0; j < playerNum; ++j)
            if (rank[i] == id[j])
            {
                cout << j << " ";
                break;
            }
    cout << endl;

    closeReplayFile();
    return 0;
}